

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::DeleteLogDestinations(void)

{
  lock_guard<std::shared_mutex> local_30;
  SinkLock l;
  unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_> *log_destination;
  unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_> *__end1;
  unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_> *__begin1;
  unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_> (*__range1) [4];
  
  for (__end1 = (unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_> *)
                log_destinations_;
      __end1 != (unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_> *)
                (anonymous_namespace)::g_application_fingerprint_abi_cxx11_; __end1 = __end1 + 1) {
    l._M_device = (mutex_type *)__end1;
    std::unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_>::reset
              (__end1,(pointer)0x0);
  }
  std::lock_guard<std::shared_mutex>::lock_guard(&local_30,(mutex_type *)sink_mutex_);
  std::
  unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
  ::reset((unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
           *)&sinks_,(pointer)0x0);
  std::lock_guard<std::shared_mutex>::~lock_guard(&local_30);
  return;
}

Assistant:

void LogDestination::DeleteLogDestinations() {
  for (auto& log_destination : log_destinations_) {
    log_destination.reset();
  }
  SinkLock l{sink_mutex_};
  sinks_.reset();
}